

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestOutputCoverage::TestOutputCoverage(TestOutputCoverage *this)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  TestOutputCoverage *local_10;
  TestOutputCoverage *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"OutputCoverage",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Test",&local_69);
  testinator::Test::Test(&this->super_Test,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestOutputCoverage_002c2590;
  return;
}

Assistant:

DEF_TEST(OutputCoverage, Test)
{
  testinator::TestRegistry r;
  std::unique_ptr<testinator::Outputter> op =
    testinator::MakeOutputter("TAP", testinator::OF_NONE);
  TestOutputCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests();
  return true;
}